

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t
zeGetCommandListExpProcAddrTable(ze_api_version_t version,ze_command_list_exp_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_command_list_exp_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((tracing_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
      DAT_001894b8 = pDdiTable->pfnGetNextCommandIdWithKernelsExp;
      DAT_001894c0 = pDdiTable->pfnUpdateMutableCommandKernelsExp;
      pDdiTable->pfnGetNextCommandIdWithKernelsExp =
           tracing_layer::zeCommandListGetNextCommandIdWithKernelsExp;
      pDdiTable->pfnUpdateMutableCommandKernelsExp =
           tracing_layer::zeCommandListUpdateMutableCommandKernelsExp;
      DAT_00189488 = pDdiTable->pfnCreateCloneExp;
      DAT_00189490 = pDdiTable->pfnImmediateAppendCommandListsExp;
      pDdiTable->pfnCreateCloneExp = tracing_layer::zeCommandListCreateCloneExp;
      pDdiTable->pfnImmediateAppendCommandListsExp =
           tracing_layer::zeCommandListImmediateAppendCommandListsExp;
      DAT_00189498 = pDdiTable->pfnGetNextCommandIdExp;
      DAT_001894a0 = pDdiTable->pfnUpdateMutableCommandsExp;
      pDdiTable->pfnGetNextCommandIdExp = tracing_layer::zeCommandListGetNextCommandIdExp;
      pDdiTable->pfnUpdateMutableCommandsExp = tracing_layer::zeCommandListUpdateMutableCommandsExp;
      DAT_001894a8 = pDdiTable->pfnUpdateMutableCommandSignalEventExp;
      DAT_001894b0 = pDdiTable->pfnUpdateMutableCommandWaitEventsExp;
      pDdiTable->pfnUpdateMutableCommandSignalEventExp =
           tracing_layer::zeCommandListUpdateMutableCommandSignalEventExp;
      pDdiTable->pfnUpdateMutableCommandWaitEventsExp =
           tracing_layer::zeCommandListUpdateMutableCommandWaitEventsExp;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetCommandListExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_command_list_exp_dditable_t* pDdiTable       ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.CommandListExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetNextCommandIdWithKernelsExp           = pDdiTable->pfnGetNextCommandIdWithKernelsExp;
    pDdiTable->pfnGetNextCommandIdWithKernelsExp         = tracing_layer::zeCommandListGetNextCommandIdWithKernelsExp;

    dditable.pfnUpdateMutableCommandKernelsExp           = pDdiTable->pfnUpdateMutableCommandKernelsExp;
    pDdiTable->pfnUpdateMutableCommandKernelsExp         = tracing_layer::zeCommandListUpdateMutableCommandKernelsExp;

    dditable.pfnCreateCloneExp                           = pDdiTable->pfnCreateCloneExp;
    pDdiTable->pfnCreateCloneExp                         = tracing_layer::zeCommandListCreateCloneExp;

    dditable.pfnImmediateAppendCommandListsExp           = pDdiTable->pfnImmediateAppendCommandListsExp;
    pDdiTable->pfnImmediateAppendCommandListsExp         = tracing_layer::zeCommandListImmediateAppendCommandListsExp;

    dditable.pfnGetNextCommandIdExp                      = pDdiTable->pfnGetNextCommandIdExp;
    pDdiTable->pfnGetNextCommandIdExp                    = tracing_layer::zeCommandListGetNextCommandIdExp;

    dditable.pfnUpdateMutableCommandsExp                 = pDdiTable->pfnUpdateMutableCommandsExp;
    pDdiTable->pfnUpdateMutableCommandsExp               = tracing_layer::zeCommandListUpdateMutableCommandsExp;

    dditable.pfnUpdateMutableCommandSignalEventExp       = pDdiTable->pfnUpdateMutableCommandSignalEventExp;
    pDdiTable->pfnUpdateMutableCommandSignalEventExp     = tracing_layer::zeCommandListUpdateMutableCommandSignalEventExp;

    dditable.pfnUpdateMutableCommandWaitEventsExp        = pDdiTable->pfnUpdateMutableCommandWaitEventsExp;
    pDdiTable->pfnUpdateMutableCommandWaitEventsExp      = tracing_layer::zeCommandListUpdateMutableCommandWaitEventsExp;

    return result;
}